

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_is_container_mark
              (MD_CTX *ctx,uint indent,MD_OFFSET beg,MD_OFFSET *p_end,MD_CONTAINER *p_container)

{
  char cVar1;
  MD_CHAR *pMVar2;
  uint uVar3;
  MD_OFFSET MVar4;
  uint uVar5;
  void *pvVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar11 = ctx->size;
  if (uVar11 <= beg) {
    return 0;
  }
  if (ctx->code_indent_offset <= indent) {
    return 0;
  }
  pMVar2 = ctx->text;
  uVar9 = (ulong)beg;
  cVar1 = pMVar2[uVar9];
  if (cVar1 != '\0') {
    if (cVar1 == '>') {
      p_container->ch = '>';
      *(undefined2 *)&p_container->field_0x1 = 0;
      p_container->mark_indent = indent;
      uVar11 = indent + 1;
      uVar10 = (ulong)(beg + 1);
      goto LAB_005c8f19;
    }
    pvVar6 = memchr("-+*",(int)cVar1,4);
    if ((pvVar6 != (void *)0x0) &&
       ((uVar10 = uVar9 + 1, uVar11 <= (uint)uVar10 ||
        (((ulong)(byte)pMVar2[uVar10] < 0x21 &&
         ((0x100002600U >> ((ulong)(byte)pMVar2[uVar10] & 0x3f) & 1) != 0)))))) {
      p_container->ch = cVar1;
      *(undefined2 *)&p_container->field_0x1 = 0;
      p_container->mark_indent = indent;
      uVar11 = indent + 1;
      goto LAB_005c8f19;
    }
  }
  uVar3 = beg + 9;
  if (uVar11 <= beg + 9) {
    uVar3 = uVar11;
  }
  p_container->start = 0;
  if (uVar3 <= beg) {
    return 0;
  }
  pbVar7 = (byte *)(pMVar2 + uVar9);
  uVar8 = 0;
  MVar4 = beg;
  do {
    uVar5 = MVar4;
    if (9 < (byte)(*pbVar7 - 0x30)) break;
    uVar8 = ((uint)*pbVar7 + uVar8 * 10) - 0x30;
    p_container->start = uVar8;
    MVar4 = MVar4 + 1;
    pbVar7 = pbVar7 + 1;
    uVar5 = uVar3;
  } while (uVar3 != MVar4);
  if (uVar11 <= uVar5 || uVar5 <= beg) {
    return 0;
  }
  cVar1 = pMVar2[uVar5];
  if ((cVar1 != '.') && (cVar1 != ')')) {
    return 0;
  }
  uVar10 = (ulong)uVar5 + 1;
  if ((uint)uVar10 < uVar11) {
    if (0x20 < (ulong)(byte)pMVar2[uVar10]) {
      return 0;
    }
    if ((0x100002600U >> ((ulong)(byte)pMVar2[uVar10] & 0x3f) & 1) == 0) {
      return 0;
    }
  }
  p_container->ch = cVar1;
  *(undefined2 *)&p_container->field_0x1 = 0;
  p_container->mark_indent = indent;
  uVar11 = (indent - beg) + uVar5 + 1;
LAB_005c8f19:
  p_container->contents_indent = uVar11;
  *p_end = (MD_OFFSET)uVar10;
  return 1;
}

Assistant:

static int
md_is_container_mark(MD_CTX* ctx, unsigned indent, OFF beg, OFF* p_end, MD_CONTAINER* p_container)
{
    OFF off = beg;
    OFF max_end;

    if(off >= ctx->size  ||  indent >= ctx->code_indent_offset)
        return FALSE;

    /* Check for block quote mark. */
    if(CH(off) == _T('>')) {
        off++;
        p_container->ch = _T('>');
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off;
        return TRUE;
    }

    /* Check for list item bullet mark. */
    if(ISANYOF(off, _T("-+*"))  &&  (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1))) {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + 1;
        *p_end = off+1;
        return TRUE;
    }

    /* Check for ordered list item marks. */
    max_end = off + 9;
    if(max_end > ctx->size)
        max_end = ctx->size;
    p_container->start = 0;
    while(off < max_end  &&  ISDIGIT(off)) {
        p_container->start = p_container->start * 10 + CH(off) - _T('0');
        off++;
    }
    if(off > beg  &&
       off < ctx->size  &&
       (CH(off) == _T('.') || CH(off) == _T(')'))  &&
       (off+1 >= ctx->size || ISBLANK(off+1) || ISNEWLINE(off+1)))
    {
        p_container->ch = CH(off);
        p_container->is_loose = FALSE;
        p_container->is_task = FALSE;
        p_container->mark_indent = indent;
        p_container->contents_indent = indent + off - beg + 1;
        *p_end = off+1;
        return TRUE;
    }

    return FALSE;
}